

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O1

void __thiscall EDColor::MyRGB2LabFast(EDColor *this)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (!LUT_Initialized) {
    InitColorEDLib();
  }
  uVar11 = (long)this->height * (long)this->width;
  iVar10 = (int)uVar11;
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar9 = uVar11 * 8;
  }
  pvVar4 = operator_new__(uVar9);
  pvVar5 = operator_new__(uVar9);
  pvVar6 = operator_new__(uVar9);
  if (0 < iVar10) {
    puVar1 = this->redImg;
    puVar2 = this->blueImg;
    puVar3 = this->greenImg;
    uVar9 = 0;
    do {
      dVar15 = LUT1[(int)(((double)puVar1[uVar9] / 255.0) * 4194304.0 + 0.5)] * 100.0;
      dVar14 = LUT1[(int)(((double)puVar3[uVar9] / 255.0) * 4194304.0 + 0.5)] * 100.0;
      dVar13 = LUT1[(int)(((double)puVar2[uVar9] / 255.0) * 4194304.0 + 0.5)] * 100.0;
      dVar12 = LUT2[(int)(((dVar13 * 0.072175 + dVar15 * 0.2126729 + dVar14 * 0.7151522) / 100.0) *
                          4194304.0 + 0.5)];
      *(double *)((long)pvVar4 + uVar9 * 8) = dVar12 * 116.0 + -16.0;
      *(double *)((long)pvVar5 + uVar9 * 8) =
           (LUT2[(int)(((dVar13 * 0.1804375 + dVar15 * 0.4124564 + dVar14 * 0.3575761) / 95.047) *
                       4194304.0 + 0.5)] / dVar12) * 500.0;
      *(double *)((long)pvVar6 + uVar9 * 8) =
           (dVar12 - LUT2[(int)(((dVar13 * 0.9503041 + dVar15 * 0.0193339 + dVar14 * 0.119192) /
                                108.883) * 4194304.0 + 0.5)]) * 200.0;
      uVar9 = uVar9 + 1;
    } while ((uVar11 & 0xffffffff) != uVar9);
  }
  if (iVar10 < 1) {
    dVar13 = -10000000000.0;
    dVar12 = 10000000000.0;
  }
  else {
    dVar12 = 10000000000.0;
    dVar13 = -10000000000.0;
    uVar9 = 0;
    do {
      dVar14 = *(double *)((long)pvVar4 + uVar9 * 8);
      dVar15 = dVar14;
      if ((dVar14 < dVar12) || (dVar15 = dVar12, dVar14 <= dVar13)) {
        dVar12 = dVar15;
        dVar14 = dVar13;
      }
      dVar13 = dVar14;
      uVar9 = uVar9 + 1;
    } while ((uVar11 & 0xffffffff) != uVar9);
  }
  uVar8 = this->height * this->width;
  uVar9 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    lVar7 = 0;
    do {
      this->L_Img[lVar7] =
           (uchar)(int)((*(double *)((long)pvVar4 + lVar7 * 8) - dVar12) *
                       (255.0 / (dVar13 - dVar12)));
      lVar7 = lVar7 + 1;
      uVar9 = (long)this->height * (long)this->width;
    } while (lVar7 < (long)uVar9);
  }
  if ((int)uVar9 < 1) {
    dVar12 = -10000000000.0;
    dVar13 = 10000000000.0;
  }
  else {
    dVar13 = 10000000000.0;
    uVar11 = 0;
    dVar14 = -10000000000.0;
    do {
      dVar12 = *(double *)((long)pvVar5 + uVar11 * 8);
      dVar15 = dVar12;
      if ((dVar12 < dVar13) || (dVar15 = dVar13, dVar12 <= dVar14)) {
        dVar13 = dVar15;
        dVar12 = dVar14;
      }
      uVar11 = uVar11 + 1;
      dVar14 = dVar12;
    } while ((uVar9 & 0xffffffff) != uVar11);
  }
  uVar8 = this->height * this->width;
  uVar9 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    lVar7 = 0;
    do {
      this->a_Img[lVar7] =
           (uchar)(int)((*(double *)((long)pvVar5 + lVar7 * 8) - dVar13) *
                       (255.0 / (dVar12 - dVar13)));
      lVar7 = lVar7 + 1;
      uVar9 = (long)this->height * (long)this->width;
    } while (lVar7 < (long)uVar9);
  }
  if ((int)uVar9 < 1) {
    dVar12 = -10000000000.0;
    dVar13 = 10000000000.0;
  }
  else {
    dVar13 = 10000000000.0;
    uVar11 = 0;
    dVar14 = -10000000000.0;
    do {
      dVar12 = *(double *)((long)pvVar6 + uVar11 * 8);
      dVar15 = dVar12;
      if ((dVar12 < dVar13) || (dVar15 = dVar13, dVar12 <= dVar14)) {
        dVar13 = dVar15;
        dVar12 = dVar14;
      }
      uVar11 = uVar11 + 1;
      dVar14 = dVar12;
    } while ((uVar9 & 0xffffffff) != uVar11);
  }
  if (0 < this->height * this->width) {
    lVar7 = 0;
    do {
      this->b_Img[lVar7] =
           (uchar)(int)((*(double *)((long)pvVar6 + lVar7 * 8) - dVar13) *
                       (255.0 / (dVar12 - dVar13)));
      lVar7 = lVar7 + 1;
    } while (lVar7 < (long)this->height * (long)this->width);
  }
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  operator_delete__(pvVar6);
  return;
}

Assistant:

void EDColor::MyRGB2LabFast()
{
	// Inialize LUTs if necessary
	if (!LUT_Initialized) 
		InitColorEDLib();

	// First RGB 2 XYZ
	double red, green, blue;
	double x, y, z;

	// Space for temp. allocation
	double *L = new double[width*height];
	double *a = new double[width*height];
	double *b = new double[width*height];

	for (int i = 0; i<width*height; i++) {
		red = redImg[i] / 255.0;
		green = greenImg[i] / 255.0;
		blue = blueImg[i] / 255.0;

		red = LUT1[(int)(red*LUT_SIZE + 0.5)];
		green = LUT1[(int)(green*LUT_SIZE + 0.5)];
		blue = LUT1[(int)(blue*LUT_SIZE + 0.5)];

		red = red * 100;
		green = green * 100;
		blue = blue * 100;

		//Observer. = 2°, Illuminant = D65
		x = red*0.4124564 + green*0.3575761 + blue*0.1804375;
		y = red*0.2126729 + green*0.7151522 + blue*0.0721750;
		z = red*0.0193339 + green*0.1191920 + blue*0.9503041;

		// Now xyz 2 Lab
		double refX = 95.047;
		double refY = 100.000;
		double refZ = 108.883;

		x = x / refX;          //ref_X =  95.047   Observer= 2°, Illuminant= D65
		y = y / refY;          //ref_Y = 100.000
		z = z / refZ;          //ref_Z = 108.883

		x = LUT2[(int)(x*LUT_SIZE + 0.5)];
		y = LUT2[(int)(y*LUT_SIZE + 0.5)];
		z = LUT2[(int)(z*LUT_SIZE + 0.5)];

		L[i] = (116.0*y) - 16;
		a[i] = 500 * (x / y);
		b[i] = 200 * (y - z);
	} //end-for
	
	// Scale L to [0-255]
	double min = 1e10;
	double max = -1e10;
	for (int i = 0; i<width*height; i++) {
		if (L[i]<min) min = L[i];
		else if (L[i]>max) max = L[i];
	} //end-for

	double scale = 255.0 / (max - min);
	for (int i = 0; i<width*height; i++) { L_Img[i] = (unsigned char)((L[i] - min)*scale); }

	// Scale a to [0-255]
	min = 1e10;
	max = -1e10;
	for (int i = 0; i<width*height; i++) {
		if (a[i]<min) min = a[i];
		else if (a[i]>max) max = a[i];
	} //end-for

	scale = 255.0 / (max - min);
	for (int i = 0; i<width*height; i++) { a_Img[i] = (unsigned char)((a[i] - min)*scale); }

	// Scale b to [0-255]
	min = 1e10;
	max = -1e10;
	for (int i = 0; i<width*height; i++) {
		if (b[i]<min) min = b[i];
		else if (b[i]>max) max = b[i];
	} //end-for

	scale = 255.0 / (max - min);
	for (int i = 0; i<width*height; i++) { b_Img[i] = (unsigned char)((b[i] - min)*scale); }

									   
	// clean space
	delete[] L;
	delete[] a;
	delete[] b;
}